

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallFileSetGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallFileSetGenerator::cmInstallFileSetGenerator
          (cmInstallFileSetGenerator *this,string *targetName,cmFileSet *fileSet,string *dest,
          string *file_permissions,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configurations,string *component,MessageLevel message,bool exclude_from_all,bool optional
          ,cmListFileBacktrace *backtrace)

{
  byte bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *configurations_00;
  cmListFileBacktrace local_a0 [2];
  string local_80;
  string local_60;
  byte local_3a;
  byte local_39;
  bool optional_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_38;
  bool exclude_from_all_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *configurations_local;
  string *file_permissions_local;
  string *dest_local;
  cmFileSet *fileSet_local;
  string *targetName_local;
  cmInstallFileSetGenerator *this_local;
  
  local_39 = exclude_from_all;
  local_3a = optional;
  pvStack_38 = configurations;
  configurations_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)file_permissions;
  file_permissions_local = dest;
  dest_local = &fileSet->Name;
  fileSet_local = (cmFileSet *)targetName;
  targetName_local = (string *)this;
  std::__cxx11::string::string((string *)&local_60,(string *)dest);
  configurations_00 = pvStack_38;
  std::__cxx11::string::string((string *)&local_80,(string *)component);
  bVar1 = local_39;
  cmListFileBacktrace::cmListFileBacktrace(local_a0,backtrace);
  cmInstallGenerator::cmInstallGenerator
            (&this->super_cmInstallGenerator,&local_60,configurations_00,&local_80,message,
             (bool)(bVar1 & 1),false,local_a0);
  cmListFileBacktrace::~cmListFileBacktrace(local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  (this->super_cmInstallGenerator).super_cmScriptGenerator._vptr_cmScriptGenerator =
       (_func_int **)&PTR__cmInstallFileSetGenerator_00f4fc20;
  std::__cxx11::string::string((string *)&this->TargetName,(string *)targetName);
  this->FileSet = (cmFileSet *)dest_local;
  std::__cxx11::string::string((string *)&this->FilePermissions,(string *)file_permissions);
  this->Optional = (bool)(local_3a & 1);
  (this->super_cmInstallGenerator).super_cmScriptGenerator.ActionsPerConfig = true;
  return;
}

Assistant:

cmInstallFileSetGenerator::cmInstallFileSetGenerator(
  std::string targetName, cmFileSet* fileSet, std::string const& dest,
  std::string file_permissions, std::vector<std::string> const& configurations,
  std::string const& component, MessageLevel message, bool exclude_from_all,
  bool optional, cmListFileBacktrace backtrace)
  : cmInstallGenerator(dest, configurations, component, message,
                       exclude_from_all, false, std::move(backtrace))
  , TargetName(std::move(targetName))
  , FileSet(fileSet)
  , FilePermissions(std::move(file_permissions))
  , Optional(optional)
{
  this->ActionsPerConfig = true;
}